

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

MessageStore * __thiscall
FIX::MessageStoreFactoryExceptionWrapper::create
          (MessageStoreFactoryExceptionWrapper *this,UtcTimeStamp *now,SessionID *sessionID,
          bool *threw,ConfigError *ex)

{
  MessageStore *pMVar1;
  ConfigError *e;
  ConfigError *ex_local;
  bool *threw_local;
  SessionID *sessionID_local;
  UtcTimeStamp *now_local;
  MessageStoreFactoryExceptionWrapper *this_local;
  
  *threw = false;
  pMVar1 = (MessageStore *)(**(code **)(**(long **)this + 0x10))(*(long **)this,now,sessionID);
  return pMVar1;
}

Assistant:

MessageStore *MessageStoreFactoryExceptionWrapper::create(
    const UtcTimeStamp &now,
    const SessionID &sessionID,
    bool &threw,
    ConfigError &ex) {
  threw = false;
  try {
    return m_pFactory->create(now, sessionID);
  } catch (ConfigError &e) {
    threw = true;
    ex = e;
    return 0;
  }
}